

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testoled.cxx
# Opt level: O0

int main(void)

{
  result_type_conflict1 rVar1;
  int iVar2;
  result_type x;
  result_type y;
  OledPoint p_00;
  bool bVar3;
  exception *e;
  OledPoint p;
  uniform_int_distribution<int> yDistribution;
  uniform_int_distribution<int> xDistribution;
  mt19937 randomGenerator;
  random_device randomDevice;
  PressedKey key;
  LinuxKeys linuxKeys;
  OledI2C oled;
  int in_stack_ffffffffffffd368;
  int in_stack_ffffffffffffd36c;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffd370;
  undefined4 in_stack_ffffffffffffd380;
  undefined4 in_stack_ffffffffffffd384;
  undefined8 in_stack_ffffffffffffd388;
  PixelStyle style;
  undefined4 in_stack_ffffffffffffd390;
  undefined4 in_stack_ffffffffffffd394;
  undefined4 in_stack_ffffffffffffd398;
  undefined4 in_stack_ffffffffffffd39c;
  LinuxKeys *in_stack_ffffffffffffd3b0;
  Point<int> local_2c40;
  PressedKey local_2c38;
  OledI2C *in_stack_ffffffffffffd440;
  uint8_t in_stack_ffffffffffffd567;
  string *in_stack_ffffffffffffd568;
  OledI2C *in_stack_ffffffffffffd570;
  PressedKey local_510 [9];
  OledPoint local_4c4;
  Point<int> local_4bc [3];
  allocator local_4a1;
  string local_4a0 [32];
  OledI2C local_480;
  undefined4 local_4;
  
  style = (PixelStyle)((ulong)in_stack_ffffffffffffd388 >> 0x20);
  local_4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a0,"/dev/i2c-1",&local_4a1);
  SSD1306::OledI2C::OledI2C
            (in_stack_ffffffffffffd570,in_stack_ffffffffffffd568,in_stack_ffffffffffffd567);
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  SSD1306::Point<int>::Point(local_4bc,0x20,0x18);
  p_00 = SSD1306::drawString8x16
                   ((OledPoint *)CONCAT44(in_stack_ffffffffffffd39c,in_stack_ffffffffffffd398),
                    (char *)CONCAT44(in_stack_ffffffffffffd394,in_stack_ffffffffffffd390),style,
                    (OledPixel *)CONCAT44(in_stack_ffffffffffffd384,in_stack_ffffffffffffd380));
  local_4c4 = p_00;
  SSD1306::OledI2C::displayUpdate(in_stack_ffffffffffffd440);
  LinuxKeys::LinuxKeys(in_stack_ffffffffffffd3b0);
  LinuxKeys::PressedKey::PressedKey(local_510,false,0);
  std::random_device::random_device((random_device *)in_stack_ffffffffffffd3b0);
  rVar1 = std::random_device::operator()((random_device *)0x1075ed);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            (in_stack_ffffffffffffd370,CONCAT44(in_stack_ffffffffffffd36c,in_stack_ffffffffffffd368)
            );
  iVar2 = SSD1306::OledI2C::width(&local_480);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)in_stack_ffffffffffffd370,in_stack_ffffffffffffd36c,
             in_stack_ffffffffffffd368);
  SSD1306::OledI2C::height(&local_480);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)in_stack_ffffffffffffd370,in_stack_ffffffffffffd36c,
             in_stack_ffffffffffffd368);
  while (local_510[0].key != 0x1b) {
    local_2c38 = LinuxKeys::pressed((LinuxKeys *)
                                    CONCAT44(in_stack_ffffffffffffd36c,in_stack_ffffffffffffd368));
    local_510[0].key = local_2c38.key;
    local_510[0] = local_2c38;
    if (local_510[0].key == 0x2b) {
      SSD1306::OledI2C::displayOn((OledI2C *)0x1077a6);
    }
    else if (local_510[0].key == 0x2d) {
      SSD1306::OledI2C::displayOff((OledI2C *)0x1077b7);
    }
    else if (local_510[0].key == 0x69) {
      SSD1306::OledI2C::displayInverse((OledI2C *)0x107784);
    }
    else {
      bVar3 = local_510[0].key == 0x6e;
      if (bVar3) {
        SSD1306::OledI2C::displayNormal((OledI2C *)0x107795);
      }
    }
    x = std::uniform_int_distribution<int>::operator()
                  ((uniform_int_distribution<int> *)in_stack_ffffffffffffd370,
                   (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                    *)CONCAT44(in_stack_ffffffffffffd36c,in_stack_ffffffffffffd368));
    y = std::uniform_int_distribution<int>::operator()
                  ((uniform_int_distribution<int> *)in_stack_ffffffffffffd370,
                   (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                    *)CONCAT44(in_stack_ffffffffffffd36c,in_stack_ffffffffffffd368));
    SSD1306::Point<int>::Point(&local_2c40,x,y);
    SSD1306::OledI2C::xorPixel((OledI2C *)CONCAT44(rVar1,iVar2),p_00);
    SSD1306::OledI2C::displayUpdate(in_stack_ffffffffffffd440);
  }
  SSD1306::OledI2C::clear((OledI2C *)0x107838);
  SSD1306::OledI2C::displayUpdate(in_stack_ffffffffffffd440);
  std::random_device::~random_device((random_device *)0x107856);
  LinuxKeys::~LinuxKeys((LinuxKeys *)0x107863);
  SSD1306::OledI2C::~OledI2C((OledI2C *)in_stack_ffffffffffffd370);
  return 0;
}

Assistant:

int
main()
{
    try
    {
        SSD1306::OledI2C oled{"/dev/i2c-1", 0x3C};
        drawString8x16(SSD1306::OledPoint{32, 24},
                       "Oled I" "\xFD" "C",
                       SSD1306::PixelStyle::Set,
                       oled);
        oled.displayUpdate();

        //-----------------------------------------------------------------

        LinuxKeys linuxKeys;
        LinuxKeys::PressedKey key;

        //-----------------------------------------------------------------


        std::random_device randomDevice;
        std::mt19937 randomGenerator{randomDevice()};
        std::uniform_int_distribution<> xDistribution{0, oled.width() - 1};
        std::uniform_int_distribution<> yDistribution{0, oled.height() - 1};


        //-----------------------------------------------------------------

        while(key.key != 27)
        {
            key = linuxKeys.pressed();

            switch (key.key)
            {
            case 'i':

                oled.displayInverse();

                break;

            case 'n':

                oled.displayNormal();

                break;

            case '+':

                oled.displayOn();

                break;

            case '-':

                oled.displayOff();

                break;
            }

            SSD1306::OledPoint p{xDistribution(randomGenerator),
                                 yDistribution(randomGenerator)};

            oled.xorPixel(p);
            oled.displayUpdate();
        }

        oled.clear();
        oled.displayUpdate();
    }
    catch (std::exception& e)
    {
        std::cerr << e.what() << "\n";
    }

    return 0;
}